

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O3

void * __thiscall
Diligent::FixedLinearAllocator::Allocate(FixedLinearAllocator *this,size_t size,size_t alignment)

{
  uint8_t *puVar1;
  char (*Args_1) [25];
  ulong uVar2;
  pointer pDVar3;
  pointer in_R8;
  uint8_t *puVar4;
  size_t sVar5;
  string msg;
  char (*in_stack_ffffffffffffff98) [2];
  string local_60;
  ulong local_40;
  size_t local_38;
  size_t local_30;
  
  local_38 = alignment;
  local_30 = size;
  if ((size != 0) && (this->m_pDataStart == (uint8_t *)0x0)) {
    FormatString<char[30]>(&local_60,(char (*) [30])"Memory has not been allocated");
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xe0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_38 ^ local_38 - 1) <= local_38 - 1) {
    FormatString<char[33]>(&local_60,(char (*) [33])"Alignment is not a power of two!");
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xe1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  sVar5 = local_30;
  if (local_30 == 0) {
    puVar4 = (uint8_t *)0x0;
  }
  else {
    local_40 = local_38;
    if ((local_38 ^ local_38 - 1) <= local_38 - 1) {
      FormatString<char[12],unsigned_long,char[23]>
                (&local_60,(Diligent *)"Alignment (",(char (*) [12])&local_40,
                 (unsigned_long *)") must be a power of 2",(char (*) [23])in_R8);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    Args_1 = (char (*) [25])(sVar5 + local_40 + -1);
    local_30 = -local_40 & (ulong)Args_1;
    if (this->m_DbgUsingExternalMemory == false) {
      uVar2 = this->m_DbgCurrAllocation;
      pDVar3 = (this->m_DbgAllocations).
               super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_DbgAllocations).
                         super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 >> 3) *
                 -0x5555555555555555) <= uVar2) {
        FormatString<char[82]>
                  (&local_60,
                   (char (*) [82])
                   "Allocation number exceed the number of allocations that were originally reserved."
                  );
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xec);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        uVar2 = this->m_DbgCurrAllocation;
        pDVar3 = (this->m_DbgAllocations).
                 super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      this->m_DbgCurrAllocation = uVar2 + 1;
      pDVar3 = pDVar3 + uVar2;
      if (pDVar3->size != local_30) {
        in_R8 = pDVar3;
        FormatString<char[18],unsigned_long,char[48],unsigned_long,char[2]>
                  (&local_60,(Diligent *)"Allocation size (",(char (*) [18])&local_30,
                   (unsigned_long *)") does not match the initially requested size (",
                   (char (*) [48])pDVar3,(unsigned_long *)0x343766,in_stack_ffffffffffffff98);
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xee);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      if (pDVar3->alignment != local_38) {
        in_R8 = (pointer)&pDVar3->alignment;
        FormatString<char[23],unsigned_long,char[53],unsigned_long,char[2]>
                  (&local_60,(Diligent *)"Allocation alignment (",(char (*) [23])&local_38,
                   (unsigned_long *)") does not match the initially requested alignment (",
                   (char (*) [53])in_R8,(unsigned_long *)0x343766,in_stack_ffffffffffffff98);
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xef);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      sVar5 = pDVar3->reserved_size;
    }
    else {
      if ((this->m_DbgAllocations).
          super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->m_DbgAllocations).
          super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        FormatString<char[26],char[25]>
                  (&local_60,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_DbgAllocations.empty()",Args_1);
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xf5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      sVar5 = 0;
    }
    puVar4 = this->m_pCurrPtr;
    local_40 = this->m_CurrAlignment;
    puVar1 = puVar4;
    if ((local_40 ^ local_40 - 1) <= local_40 - 1) {
      FormatString<char[12],unsigned_long,char[23]>
                (&local_60,(Diligent *)"Alignment (",(char (*) [12])&local_40,
                 (unsigned_long *)") must be a power of 2",(char (*) [23])in_R8);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      puVar1 = this->m_pCurrPtr;
    }
    if (puVar1 != (uint8_t *)(-local_40 & (ulong)(puVar4 + (local_40 - 1)))) {
      FormatString<char[43]>(&local_60,(char (*) [43])"Current pointer is not aligned as expected");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0xf9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      puVar1 = this->m_pCurrPtr;
    }
    local_40 = local_38;
    if ((local_38 ^ local_38 - 1) <= local_38 - 1) {
      FormatString<char[12],unsigned_long,char[23]>
                (&local_60,(Diligent *)"Alignment (",(char (*) [12])&local_40,
                 (unsigned_long *)") must be a power of 2",(char (*) [23])in_R8);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    puVar4 = (uint8_t *)(-local_40 & (ulong)(puVar1 + (local_40 - 1)));
    this->m_pCurrPtr = puVar4;
    this->m_CurrAlignment = local_38;
    puVar1 = this->m_pDataStart;
    if ((this->m_DbgUsingExternalMemory == false) && (puVar1 + sVar5 < puVar4 + local_30)) {
      FormatString<char[76]>
                (&local_60,
                 (char (*) [76])
                 "Allocation size exceeds the initially reserved space. This is likely a bug.");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0xfe);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      puVar1 = this->m_pDataStart;
      puVar4 = this->m_pCurrPtr;
    }
    this->m_pCurrPtr = puVar4 + local_30;
    if (puVar1 + this->m_ReservedSize < puVar4 + local_30) {
      FormatString<char[43]>(&local_60,(char (*) [43])"Allocation size exceeds the reserved space");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0x103);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return puVar4;
}

Assistant:

NODISCARD void* Allocate(size_t size, size_t alignment = 1)
    {
        VERIFY(size == 0 || m_pDataStart != nullptr, "Memory has not been allocated");
        VERIFY(IsPowerOfTwo(alignment), "Alignment is not a power of two!");

        if (size == 0)
            return nullptr;

        size = AlignUp(size, alignment);

#if DILIGENT_DEBUG
        size_t dbgReservedSize = 0;
        if (!m_DbgUsingExternalMemory)
        {
            VERIFY(m_DbgCurrAllocation < m_DbgAllocations.size(), "Allocation number exceed the number of allocations that were originally reserved.");
            const auto& CurrAllocation = m_DbgAllocations[m_DbgCurrAllocation++];
            VERIFY(CurrAllocation.size == size, "Allocation size (", size, ") does not match the initially requested size (", CurrAllocation.size, ")");
            VERIFY(CurrAllocation.alignment == alignment, "Allocation alignment (", alignment, ") does not match the initially requested alignment (", CurrAllocation.alignment, ")");
            dbgReservedSize = CurrAllocation.reserved_size;
        }
        else
        {
            // Allocating in place in assigned memory
            VERIFY_EXPR(m_DbgAllocations.empty());
        }
#endif

        VERIFY(AlignUp(m_pCurrPtr, m_CurrAlignment) == m_pCurrPtr, "Current pointer is not aligned as expected");
        m_pCurrPtr      = AlignUp(m_pCurrPtr, alignment);
        m_CurrAlignment = alignment;

        VERIFY(m_DbgUsingExternalMemory || m_pCurrPtr + size <= m_pDataStart + dbgReservedSize,
               "Allocation size exceeds the initially reserved space. This is likely a bug.");

        auto* ptr = m_pCurrPtr;
        m_pCurrPtr += size;

        VERIFY(m_pCurrPtr <= m_pDataStart + m_ReservedSize, "Allocation size exceeds the reserved space");

        return ptr;
    }